

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

string * helics::stateString_abi_cxx11_(ConnectionState state)

{
  int iVar1;
  string *psVar2;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  if (stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                 connected_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_,
                 "connected",&local_11);
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_);
    }
  }
  if (stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_,
                 "init_requested",&local_12);
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_);
    }
  }
  if (stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::
                                 operating_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_,
                 "operating",&local_13);
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_);
    }
  }
  if (stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_,
                 "error",&local_14);
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_);
    }
  }
  if (stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_,
                 "disconnected",&local_15);
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_);
    }
  }
  if (state == CONNECTED) {
    psVar2 = &stateString[abi:cxx11](helics::ConnectionState)::connected_abi_cxx11_;
  }
  else if (state == INIT_REQUESTED) {
    psVar2 = &stateString[abi:cxx11](helics::ConnectionState)::init_abi_cxx11_;
  }
  else if (state == OPERATING) {
    psVar2 = &stateString[abi:cxx11](helics::ConnectionState)::operating_abi_cxx11_;
  }
  else if ((state == REQUEST_DISCONNECT) || (state == DISCONNECTED)) {
    psVar2 = &stateString[abi:cxx11](helics::ConnectionState)::dis_abi_cxx11_;
  }
  else {
    psVar2 = &stateString[abi:cxx11](helics::ConnectionState)::estate_abi_cxx11_;
  }
  return psVar2;
}

Assistant:

static const std::string& stateString(ConnectionState state)
{
    static const std::string connected{"connected"};
    static const std::string init{"init_requested"};
    static const std::string operating{"operating"};
    static const std::string estate{"error"};
    static const std::string dis{"disconnected"};
    switch (state) {
        case ConnectionState::OPERATING:
            return operating;
        case ConnectionState::INIT_REQUESTED:
            return init;
        case ConnectionState::CONNECTED:
            return connected;
        case ConnectionState::REQUEST_DISCONNECT:
        case ConnectionState::DISCONNECTED:
            return dis;
        case ConnectionState::ERROR_STATE:
        default:
            return estate;
    }
}